

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

TablePrinter * Catch::operator<<(TablePrinter *tp)

{
  pointer pCVar1;
  _Alloc_hider _Var2;
  long lVar3;
  long lVar4;
  ostream *poVar5;
  int extraout_EDX;
  int extraout_EDX_00;
  int __oflag;
  long **__file;
  value_type colInfo;
  string padding;
  string colStr;
  char local_91;
  long *local_90 [2];
  long local_80 [2];
  undefined8 local_70;
  char *local_68;
  long local_60;
  char local_58;
  undefined7 uStack_57;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  std::__cxx11::stringbuf::str();
  lVar3 = local_40;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"");
  __file = local_90;
  std::__cxx11::stringbuf::str((string *)((tp->m_oss).m_oss + 8));
  __oflag = extraout_EDX;
  if (local_90[0] != local_80) {
    __file = (long **)(local_80[0] + 1);
    operator_delete(local_90[0],(ulong)__file);
    __oflag = extraout_EDX_00;
  }
  TablePrinter::open(tp,(char *)__file,__oflag);
  if (tp->m_currentColumn ==
      (int)((ulong)((long)(tp->m_columnInfos).
                          super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(tp->m_columnInfos).
                         super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333 + -1) {
    tp->m_currentColumn = -1;
    local_90[0] = (long *)CONCAT71(local_90[0]._1_7_,10);
    std::__ostream_insert<char,std::char_traits<char>>(tp->m_os,(char *)local_90,1);
  }
  lVar4 = (long)tp->m_currentColumn + 1;
  tp->m_currentColumn = (int)lVar4;
  pCVar1 = (tp->m_columnInfos).
           super__Vector_base<Catch::(anonymous_namespace)::ColumnInfo,_std::allocator<Catch::(anonymous_namespace)::ColumnInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  _Var2._M_p = pCVar1[lVar4].name._M_dataplus._M_p;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_90,_Var2._M_p,_Var2._M_p + pCVar1[lVar4].name._M_string_length);
  local_70._0_4_ = pCVar1[lVar4].width;
  local_70._4_4_ = pCVar1[lVar4].justification;
  local_68 = &local_58;
  lVar4 = (long)(int)(undefined4)local_70 - (lVar3 + 1U);
  if ((ulong)(long)(int)(undefined4)local_70 < lVar3 + 1U || lVar4 == 0) {
    local_60 = 0;
    local_58 = '\0';
  }
  else {
    std::__cxx11::string::_M_construct((ulong)&local_68,(char)lVar4);
  }
  if (local_70._4_4_ == 0) {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(tp->m_os,(char *)local_48,local_40);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_68,local_60);
    local_91 = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_91,1);
  }
  else {
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(tp->m_os,local_68,local_60);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,(char *)local_48,local_40);
    local_91 = ' ';
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,&local_91,1);
  }
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return tp;
}

Assistant:

TablePrinter &operator << (TablePrinter &tp, ColumnBreak) {
            auto colStr = tp.m_oss.str();
            const auto strSize = colStr.size();
            tp.m_oss.str("");
            tp.open();
            if (tp.m_currentColumn == static_cast<int>(tp.m_columnInfos.size() - 1)) {
                tp.m_currentColumn = -1;
                tp.m_os << '\n';
            }
            tp.m_currentColumn++;

            auto colInfo = tp.m_columnInfos[tp.m_currentColumn];
            auto padding = (strSize + 1 < static_cast<std::size_t>(colInfo.width))
                ? std::string(colInfo.width - (strSize + 1), ' ')
                : std::string();
            if (colInfo.justification == Justification::Left)
                tp.m_os << colStr << padding << ' ';
            else
                tp.m_os << padding << colStr << ' ';
            return tp;
        }